

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDStats.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMDRTheta::processFrame(RNEMDRTheta *this,int istep)

{
  SelectionManager *this_00;
  int *piVar1;
  __uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
  _Var2;
  ulong uVar3;
  StuntDouble *this_01;
  pair<int,_int> pVar4;
  long lVar5;
  long lVar6;
  size_t i_1;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  int i;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  binL;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  binI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binCount;
  Mat3x3d I;
  Vector3d rPos;
  vector<double,_std::allocator<double>_> projections;
  Vector3d L;
  Vector3d vel;
  Vector3d omega;
  int local_204;
  ulong local_200;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  local_1f8;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  local_1e0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1c8;
  RectMatrix<double,_3U,_3U> local_1b0;
  Vector<double,_3U> local_168;
  RectMatrix<double,_3U,_3U> local_150;
  Vector<double,_3U> local_108;
  RectMatrix<double,_3U,_3U> local_f0;
  Vector3d local_a8;
  Vector3d local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  ShellStatistics::processFrame(&this->super_ShellStatistics,istep);
  if ((this->super_ShellStatistics).super_SpatialStatistics.evaluator_.isDynamic_ == true) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)&local_1b0,
               &(this->super_ShellStatistics).super_SpatialStatistics.evaluator_);
    SelectionManager::setSelectionSet
              (&(this->super_ShellStatistics).super_SpatialStatistics.seleMan_,
               (SelectionSet *)&local_1b0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1b0);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1c8,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_1b0);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::vector(&local_1e0,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_1b0);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector(&local_1f8,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_1b0);
  lVar5 = 0;
  for (uVar7 = 0;
      uVar7 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_;
      uVar7 = uVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&((local_1c8.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar5),(long)this->nAngleBins_);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    resize((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *
           )((long)&((local_1e0.
                      super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar5),(long)this->nAngleBins_);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               ((long)&((local_1f8.
                         super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar5),(long)this->nAngleBins_);
    lVar5 = lVar5 + 0x18;
  }
  this_00 = &(this->super_ShellStatistics).super_SpatialStatistics.seleMan_;
  this_01 = SelectionManager::beginSelected(this_00,&local_204);
  while (this_01 != (StuntDouble *)0x0) {
    StuntDouble::getPos(&local_90,this_01);
    pVar4 = getBins(this,&local_90);
    uVar9 = pVar4.first;
    if ((((-1 < (int)uVar9) && (-1 < (long)pVar4)) &&
        ((int)uVar9 <
         (int)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_)) &&
       (uVar7 = (ulong)pVar4 >> 0x20, pVar4.second < this->nAngleBins_)) {
      StuntDouble::getPos((Vector3d *)&local_150,this_01);
      operator-((Vector<double,_3U> *)&local_1b0,(Vector<double,_3U> *)&local_150,
                &(this->super_ShellStatistics).coordinateOrigin_.super_Vector<double,_3U>);
      Vector<double,_3U>::Vector(&local_168,(Vector<double,_3U> *)&local_1b0);
      StuntDouble::getVel(&local_a8,this_01);
      dVar11 = this_01->mass_;
      cross<double>((Vector3<double> *)&local_150,(Vector3<double> *)&local_168,&local_a8);
      operator*((Vector<double,_3U> *)&local_1b0,dVar11,(Vector<double,_3U> *)&local_150);
      Vector<double,_3U>::Vector(&local_108,(Vector<double,_3U> *)&local_1b0);
      RectMatrix<double,_3U,_3U>::RectMatrix(&local_1b0,0.0);
      outProduct<double>((SquareMatrix3<double> *)&local_f0,(Vector3<double> *)&local_168,
                         (Vector3<double> *)&local_168);
      operator*(&local_78,&local_f0,dVar11);
      RectMatrix<double,_3U,_3U>::operator=(&local_150,&local_78);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)&local_1b0,(SquareMatrix<double,_3> *)&local_150);
      dVar10 = Vector<double,_3U>::lengthSquare(&local_168);
      dVar11 = dVar11 * dVar10;
      local_1b0.data_[0][0] = local_1b0.data_[0][0] + dVar11;
      local_1b0.data_[1][1] = local_1b0.data_[1][1] + dVar11;
      local_1b0.data_[2][2] = dVar11 + local_1b0.data_[2][2];
      uVar9 = uVar9 & 0x7fffffff;
      RectMatrix<double,_3U,_3U>::add
                ((RectMatrix<double,_3U,_3U> *)
                 (local_1e0.
                  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                  super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar7),&local_1b0);
      Vector<double,_3U>::add
                (&local_1f8.
                  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].super_Vector<double,_3U>,
                 &local_108);
      piVar1 = local_1c8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar7;
      *piVar1 = *piVar1 + 1;
    }
    this_01 = SelectionManager::nextSelected(this_00,&local_204);
  }
  uVar7 = 0;
  while (uVar7 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_)
  {
    (**(code **)(*(long *)(this->r_).accumulator.
                          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                          super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                          ._M_t + 0x10))
              (((double)(uVar7 & 0xffffffff) + 0.5) * (this->super_ShellStatistics).binWidth_);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_150,(long)this->nAngleBins_,
               (allocator_type *)&local_1b0);
    lVar5 = 0;
    lVar8 = 0;
    local_200 = uVar7;
    for (lVar6 = 0; uVar3 = local_200, lVar6 < this->nAngleBins_; lVar6 = lVar6 + 1) {
      local_f0.data_[0][0] = 0.0;
      Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1b0,(double *)&local_f0);
      Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,(Vector<double,_3U> *)&local_1b0);
      if (0 < local_1c8.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar6]) {
        SquareMatrix3<double>::inverse
                  ((SquareMatrix3<double> *)&local_1b0,
                   (SquareMatrix3<double> *)
                   ((long)((local_1e0.
                            super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                   lVar8));
        operator*((Vector<double,_3U> *)&local_f0,&local_1b0,
                  (Vector<double,_3U> *)
                  ((long)((local_1f8.
                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                         data_ + lVar5));
        Vector3<double>::operator=((Vector3<double> *)&local_78,(Vector<double,_3U> *)&local_f0);
      }
      dVar11 = dot<double,3u>((Vector<double,_3U> *)&local_78,
                              &(this->fluxVector_).super_Vector<double,_3U>);
      *(double *)((long)local_150.data_[0][0] + lVar6 * 8) = dVar11;
      lVar8 = lVar8 + 0x48;
      lVar5 = lVar5 + 0x18;
    }
    _Var2._M_t.
    super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
    .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
         (this->angularVelocity_).accumulator.
         super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_200]._M_t.
         super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
         ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                          .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                          _M_head_impl + 0x18))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
               .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
               &local_150);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_150);
    uVar7 = uVar3 + 1;
  }
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::~vector(&local_1e0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

void RNEMDRTheta::processFrame(int istep) {
    ShellStatistics::processFrame(istep);

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    StuntDouble* sd;
    int i;

    std::vector<std::vector<int>> binCount(nBins_);
    std::vector<std::vector<Mat3x3d>> binI(nBins_);
    std::vector<std::vector<Vector3d>> binL(nBins_);

    for (std::size_t i {}; i < nBins_; ++i) {
      binCount[i].resize(nAngleBins_);
      binI[i].resize(nAngleBins_);
      binL[i].resize(nAngleBins_);
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      std::pair<int, int> bins = getBins(sd->getPos());

      if (bins.first >= 0 && bins.first < int(nBins_)) {
        if (bins.second >= 0 && bins.second < nAngleBins_) {
          Vector3d rPos = sd->getPos() - coordinateOrigin_;
          Vector3d vel  = sd->getVel();
          RealType m    = sd->getMass();
          Vector3d L    = m * cross(rPos, vel);
          Mat3x3d I(0.0);
          I           = outProduct(rPos, rPos) * m;
          RealType r2 = rPos.lengthSquare();
          I(0, 0) += m * r2;
          I(1, 1) += m * r2;
          I(2, 2) += m * r2;

          binI[bins.first][bins.second] += I;
          binL[bins.first][bins.second] += L;
          binCount[bins.first][bins.second]++;
        }
      }
    }

    for (unsigned int i = 0; i < nBins_; i++) {
      RealType r = (((RealType)i + 0.5) * binWidth_);
      r_.accumulator[i]->add(r);

      std::vector<RealType> projections(nAngleBins_);

      for (int j = 0; j < nAngleBins_; j++) {
        Vector3d omega(0.0);

        if (binCount[i][j] > 0) { omega = binI[i][j].inverse() * binL[i][j]; }

        // RealType omegaProj = dot(omega, fluxVector_);
        projections[j] = dot(omega, fluxVector_);
      }

      angularVelocity_.accumulator[i]->add(projections);
    }
  }